

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::CompactRange(DBImpl *this,Slice *begin,Slice *end)

{
  bool bVar1;
  int local_54;
  undefined1 local_50 [4];
  int level_1;
  int local_48;
  int level;
  Version *local_38;
  Version *base;
  MutexLock l;
  int max_level_with_files;
  Slice *end_local;
  Slice *begin_local;
  DBImpl *this_local;
  
  l.mu_._4_4_ = 1;
  MutexLock::MutexLock((MutexLock *)&base,&this->mutex_);
  local_38 = VersionSet::current(this->versions_);
  for (local_48 = 1; local_48 < 7; local_48 = local_48 + 1) {
    bVar1 = Version::OverlapInLevel(local_38,local_48,begin,end);
    if (bVar1) {
      l.mu_._4_4_ = local_48;
    }
  }
  MutexLock::~MutexLock((MutexLock *)&base);
  TEST_CompactMemTable((DBImpl *)local_50);
  Status::~Status((Status *)local_50);
  for (local_54 = 0; local_54 < l.mu_._4_4_; local_54 = local_54 + 1) {
    TEST_CompactRange(this,local_54,begin,end);
  }
  return;
}

Assistant:

void DBImpl::CompactRange(const Slice* begin, const Slice* end) {
  int max_level_with_files = 1;
  {
    MutexLock l(&mutex_);
    Version* base = versions_->current();
    for (int level = 1; level < config::kNumLevels; level++) {
      if (base->OverlapInLevel(level, begin, end)) {
        max_level_with_files = level;
      }
    }
  }
  TEST_CompactMemTable();  // TODO(sanjay): Skip if memtable does not overlap
  for (int level = 0; level < max_level_with_files; level++) {
    TEST_CompactRange(level, begin, end);
  }
}